

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3,unsigned_long params_4)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_68 [32];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_48;
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_48,(string *)msg);
  ::std::__cxx11::string::string(local_68,(string *)params_1);
  ConstructMessageRecursive<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,(string *)&values,&local_48,params,(unsigned_long)local_68,
             params_2,params_3,
             (unsigned_long)
             values.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_start);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}